

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::operator*=(CImg<unsigned_char> *this,uchar value)

{
  bool bVar1;
  unsigned_long uVar2;
  uchar *local_28;
  uchar *ptrd;
  uchar value_local;
  CImg<unsigned_char> *this_local;
  
  bVar1 = is_empty(this);
  if (!bVar1) {
    local_28 = this->_data;
    uVar2 = size(this);
    local_28 = local_28 + uVar2;
    while (local_28 = local_28 + -1, this->_data <= local_28) {
      *local_28 = *local_28 * value;
    }
  }
  return this;
}

Assistant:

CImg<T>& operator*=(const t value) {
      if (is_empty()) return *this;
#ifdef cimg_use_openmp
#pragma omp parallel for if (size()>=262144)
#endif
      cimg_rof(*this,ptrd,T) *ptrd = (T)(*ptrd * value);
      return *this;
    }